

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

void __thiscall ParamListStandard::calcDelay(ParamListStandard *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  int iVar3;
  
  this->maxdelay = 0;
  p_Var2 = (this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->entry) {
    iVar3 = 0;
    do {
      iVar1 = *(int *)((long)(p_Var2[2]._M_next + 6) + 4);
      if (iVar3 < iVar1) {
        this->maxdelay = iVar1;
        iVar3 = iVar1;
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->entry);
  }
  return;
}

Assistant:

void ParamListStandard::calcDelay(void)

{
  maxdelay = 0;
  list<ParamEntry>::const_iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter) {
    int4 delay = (*iter).getSpace()->getDelay();
    if (delay > maxdelay)
      maxdelay = delay;
  }
}